

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O3

void opj_pi_create_encode
               (opj_pi_iterator_t *pi,opj_cp_t *cp,OPJ_UINT32 tileno,OPJ_UINT32 pino,
               OPJ_UINT32 tpnum,OPJ_INT32 tppos,J2K_T2_MODE t2_mode)

{
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  OPJ_PROG_ORDER OVar4;
  uint uVar5;
  opj_tcp_t *poVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  OPJ_UINT32 OVar10;
  OPJ_BOOL OVar11;
  OPJ_UINT32 OVar12;
  uint uVar13;
  char *prog;
  long lVar14;
  uint uVar15;
  int pos;
  int iVar16;
  OPJ_UINT32 OVar17;
  long lVar18;
  
  poVar6 = cp->tcps;
  prog = opj_j2k_convert_progression_order(poVar6[tileno].pocs[pino].prg);
  pi[pino].first = 1;
  OVar4 = poVar6[tileno].pocs[pino].prg;
  pi[pino].poc.prg = OVar4;
  if ((*(byte *)((long)&cp->m_specific_param + 0x18) & 1) == 0) goto code_r0x0012b35a;
  if (3 < (ushort)((short)*(uint *)cp - 3U)) {
    uVar13 = *(uint *)cp & 0xffff;
    if (uVar13 < 0x400) {
      if (t2_mode != FINAL_PASS) goto code_r0x0012b35a;
    }
    else if (0x99b < uVar13 && t2_mode != FINAL_PASS) {
code_r0x0012b35a:
      OVar12 = poVar6[tileno].pocs[pino].resS;
      OVar17 = poVar6[tileno].pocs[pino].compS;
      pi[pino].poc.compno1 = poVar6[tileno].pocs[pino].compE;
      pi[pino].poc.layno0 = poVar6[tileno].pocs[pino].layS;
      uVar1 = poVar6[tileno].pocs[pino].layE;
      uVar2 = poVar6[tileno].pocs[pino].resE;
      pi[pino].poc.resno0 = OVar12;
      pi[pino].poc.compno0 = OVar17;
      pi[pino].poc.layno1 = uVar1;
      pi[pino].poc.resno1 = uVar2;
      pi[pino].poc.precno0 = poVar6[tileno].pocs[pino].prcS;
      pi[pino].poc.precno1 = poVar6[tileno].pocs[pino].prcE;
      OVar12 = poVar6[tileno].pocs[pino].txE;
      OVar17 = poVar6[tileno].pocs[pino].tyS;
      OVar10 = poVar6[tileno].pocs[pino].tyE;
      pi[pino].poc.tx0 = poVar6[tileno].pocs[pino].txS;
      pi[pino].poc.tx1 = OVar12;
      pi[pino].poc.ty0 = OVar17;
      pi[pino].poc.ty1 = OVar10;
      return;
    }
  }
  if (tppos < 3) {
    lVar14 = (long)tppos;
    do {
      bVar3 = prog[lVar14 + 1];
      if (bVar3 < 0x50) {
        if (bVar3 == 0x43) {
          pi[pino].poc.compno0 = poVar6[tileno].pocs[pino].compS;
          pi[pino].poc.compno1 = poVar6[tileno].pocs[pino].compE;
        }
        else if (bVar3 == 0x4c) {
          pi[pino].poc.layno0 = poVar6[tileno].pocs[pino].layS;
          pi[pino].poc.layno1 = poVar6[tileno].pocs[pino].layE;
        }
      }
      else if (bVar3 == 0x50) {
        if ((uint)OVar4 < 2) {
          pi[pino].poc.precno0 = poVar6[tileno].pocs[pino].prcS;
          pi[pino].poc.precno1 = poVar6[tileno].pocs[pino].prcE;
        }
        else {
          OVar12 = poVar6[tileno].pocs[pino].txE;
          OVar17 = poVar6[tileno].pocs[pino].tyS;
          OVar10 = poVar6[tileno].pocs[pino].tyE;
          pi[pino].poc.tx0 = poVar6[tileno].pocs[pino].txS;
          pi[pino].poc.tx1 = OVar12;
          pi[pino].poc.ty0 = OVar17;
          pi[pino].poc.ty1 = OVar10;
        }
      }
      else if (bVar3 == 0x52) {
        pi[pino].poc.resno0 = poVar6[tileno].pocs[pino].resS;
        pi[pino].poc.resno1 = poVar6[tileno].pocs[pino].resE;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
  }
  if (tpnum == 0) {
    if (-1 < tppos) {
      lVar14 = (ulong)(uint)tppos + 1;
      do {
        bVar3 = prog[lVar14 + -1];
        if (bVar3 < 0x50) {
          if (bVar3 == 0x43) {
            OVar12 = poVar6[tileno].pocs[pino].compS;
            pi[pino].poc.compno0 = OVar12;
            OVar12 = OVar12 + 1;
            pi[pino].poc.compno1 = OVar12;
            poVar6[tileno].pocs[pino].comp_t = OVar12;
          }
          else if (bVar3 == 0x4c) {
            OVar12 = poVar6[tileno].pocs[pino].layS;
            pi[pino].poc.layno0 = OVar12;
            OVar12 = OVar12 + 1;
            pi[pino].poc.layno1 = OVar12;
            poVar6[tileno].pocs[pino].lay_t = OVar12;
          }
        }
        else if (bVar3 == 0x50) {
          if ((uint)OVar4 < 2) {
            OVar12 = poVar6[tileno].pocs[pino].prcS;
            pi[pino].poc.precno0 = OVar12;
            OVar12 = OVar12 + 1;
            pi[pino].poc.precno1 = OVar12;
            poVar6[tileno].pocs[pino].prc_t = OVar12;
          }
          else {
            uVar13 = poVar6[tileno].pocs[pino].txS;
            uVar15 = poVar6[tileno].pocs[pino].tyS;
            pi[pino].poc.tx0 = uVar13;
            uVar5 = poVar6[tileno].pocs[pino].dx;
            OVar12 = (uVar5 + uVar13) - uVar13 % uVar5;
            pi[pino].poc.tx1 = OVar12;
            pi[pino].poc.ty0 = uVar15;
            uVar13 = poVar6[tileno].pocs[pino].dy;
            OVar17 = (uVar13 + uVar15) - uVar15 % uVar13;
            pi[pino].poc.ty1 = OVar17;
            poVar6[tileno].pocs[pino].tx0_t = OVar12;
            poVar6[tileno].pocs[pino].ty0_t = OVar17;
          }
        }
        else if (bVar3 == 0x52) {
          OVar12 = poVar6[tileno].pocs[pino].resS;
          pi[pino].poc.resno0 = OVar12;
          OVar12 = OVar12 + 1;
          pi[pino].poc.resno1 = OVar12;
          poVar6[tileno].pocs[pino].res_t = OVar12;
        }
        lVar18 = lVar14 + -1;
        bVar8 = 0 < lVar14;
        lVar14 = lVar18;
      } while (lVar18 != 0 && bVar8);
    }
  }
  else if (-1 < tppos) {
    pos = tppos + -1;
    bVar8 = true;
    lVar14 = (ulong)(uint)tppos + 1;
    do {
      bVar3 = prog[lVar14 + -1];
      if (bVar3 < 0x50) {
        if (bVar3 == 0x43) {
          OVar12 = poVar6[tileno].pocs[pino].comp_t;
          pi[pino].poc.compno0 = OVar12 - 1;
          pi[pino].poc.compno1 = OVar12;
        }
        else if (bVar3 == 0x4c) {
          OVar12 = poVar6[tileno].pocs[pino].lay_t;
          pi[pino].poc.layno0 = OVar12 - 1;
          pi[pino].poc.layno1 = OVar12;
        }
      }
      else if (bVar3 == 0x50) {
        if ((uint)OVar4 < 2) {
          OVar12 = poVar6[tileno].pocs[pino].prc_t;
          pi[pino].poc.precno0 = OVar12 - 1;
          pi[pino].poc.precno1 = OVar12;
        }
        else {
          uVar13 = poVar6[tileno].pocs[pino].dx;
          uVar15 = poVar6[tileno].pocs[pino].tx0_t;
          pi[pino].poc.tx0 = uVar15 - (uVar15 % uVar13 + uVar13);
          pi[pino].poc.tx1 = uVar15;
          uVar13 = poVar6[tileno].pocs[pino].dy;
          uVar15 = poVar6[tileno].pocs[pino].ty0_t;
          pi[pino].poc.ty0 = uVar15 - (uVar15 % uVar13 + uVar13);
          pi[pino].poc.ty1 = uVar15;
        }
      }
      else if (bVar3 == 0x52) {
        OVar12 = poVar6[tileno].pocs[pino].res_t;
        pi[pino].poc.resno0 = OVar12 - 1;
        pi[pino].poc.resno1 = OVar12;
      }
      bVar9 = false;
      bVar7 = false;
      if (bVar8) {
        bVar3 = prog[lVar14 + -1];
        bVar7 = bVar9;
        if (bVar3 < 0x50) {
          if (bVar3 == 0x43) {
            OVar12 = poVar6[tileno].pocs[pino].comp_t;
            if (OVar12 == poVar6[tileno].pocs[pino].compE) {
              OVar11 = opj_pi_check_next_level(pos,cp,tileno,pino,prog);
              if (OVar11 != 0) {
                OVar12 = poVar6[tileno].pocs[pino].compS;
                pi[pino].poc.compno0 = OVar12;
                OVar12 = OVar12 + 1;
                pi[pino].poc.compno1 = OVar12;
                poVar6[tileno].pocs[pino].comp_t = OVar12;
                goto LAB_0012b712;
              }
            }
            else {
              pi[pino].poc.compno0 = OVar12;
              pi[pino].poc.compno1 = OVar12 + 1;
              poVar6[tileno].pocs[pino].comp_t = OVar12 + 1;
            }
          }
          else if (bVar3 == 0x4c) {
            OVar12 = poVar6[tileno].pocs[pino].lay_t;
            if (OVar12 == poVar6[tileno].pocs[pino].layE) {
              OVar11 = opj_pi_check_next_level(pos,cp,tileno,pino,prog);
              bVar7 = false;
              if (OVar11 != 0) {
                OVar12 = poVar6[tileno].pocs[pino].layS;
                pi[pino].poc.layno0 = OVar12;
                OVar12 = OVar12 + 1;
                pi[pino].poc.layno1 = OVar12;
                poVar6[tileno].pocs[pino].lay_t = OVar12;
                goto LAB_0012b712;
              }
            }
            else {
              pi[pino].poc.layno0 = OVar12;
              pi[pino].poc.layno1 = OVar12 + 1;
              poVar6[tileno].pocs[pino].lay_t = OVar12 + 1;
              bVar7 = false;
            }
          }
          else {
LAB_0012b712:
            bVar7 = true;
          }
        }
        else if (bVar3 == 0x50) {
          if ((uint)OVar4 < 2) {
            OVar12 = poVar6[tileno].pocs[pino].prc_t;
            if (OVar12 == poVar6[tileno].pocs[pino].prcE) {
              OVar11 = opj_pi_check_next_level(pos,cp,tileno,pino,prog);
              if (OVar11 != 0) {
                OVar12 = poVar6[tileno].pocs[pino].prcS;
                pi[pino].poc.precno0 = OVar12;
                OVar12 = OVar12 + 1;
                pi[pino].poc.precno1 = OVar12;
                poVar6[tileno].pocs[pino].prc_t = OVar12;
                goto LAB_0012b712;
              }
            }
            else {
              pi[pino].poc.precno0 = OVar12;
              pi[pino].poc.precno1 = OVar12 + 1;
              poVar6[tileno].pocs[pino].prc_t = OVar12 + 1;
            }
          }
          else {
            uVar13 = poVar6[tileno].pocs[pino].tx0_t;
            if (uVar13 < poVar6[tileno].pocs[pino].txE) {
              pi[pino].poc.tx0 = uVar13;
              uVar15 = poVar6[tileno].pocs[pino].dx;
              iVar16 = uVar15 + uVar13;
              bVar7 = false;
            }
            else {
              uVar13 = poVar6[tileno].pocs[pino].ty0_t;
              bVar7 = false;
              if (poVar6[tileno].pocs[pino].tyE <= uVar13) {
                OVar11 = opj_pi_check_next_level(pos,cp,tileno,pino,prog);
                if (OVar11 == 0) {
                  bVar7 = false;
                  goto LAB_0012b718;
                }
                uVar13 = poVar6[tileno].pocs[pino].tyS;
                bVar7 = true;
              }
              pi[pino].poc.ty0 = uVar13;
              uVar15 = poVar6[tileno].pocs[pino].dy;
              OVar12 = (uVar15 + uVar13) - uVar13 % uVar15;
              pi[pino].poc.ty1 = OVar12;
              poVar6[tileno].pocs[pino].ty0_t = OVar12;
              uVar13 = poVar6[tileno].pocs[pino].txS;
              pi[pino].poc.tx0 = uVar13;
              uVar15 = poVar6[tileno].pocs[pino].dx;
              iVar16 = uVar15 + uVar13;
            }
            OVar12 = iVar16 - uVar13 % uVar15;
            pi[pino].poc.tx1 = OVar12;
            poVar6[tileno].pocs[pino].tx0_t = OVar12;
          }
        }
        else {
          if (bVar3 != 0x52) goto LAB_0012b712;
          OVar12 = poVar6[tileno].pocs[pino].res_t;
          if (OVar12 == poVar6[tileno].pocs[pino].resE) {
            OVar11 = opj_pi_check_next_level(pos,cp,tileno,pino,prog);
            if (OVar11 != 0) {
              OVar12 = poVar6[tileno].pocs[pino].resS;
              pi[pino].poc.resno0 = OVar12;
              OVar12 = OVar12 + 1;
              pi[pino].poc.resno1 = OVar12;
              poVar6[tileno].pocs[pino].res_t = OVar12;
              goto LAB_0012b712;
            }
          }
          else {
            pi[pino].poc.resno0 = OVar12;
            pi[pino].poc.resno1 = OVar12 + 1;
            poVar6[tileno].pocs[pino].res_t = OVar12 + 1;
          }
        }
      }
LAB_0012b718:
      bVar8 = bVar7;
      pos = pos + -1;
      lVar18 = lVar14 + -1;
      bVar7 = 0 < lVar14;
      lVar14 = lVar18;
    } while (lVar18 != 0 && bVar7);
  }
  return;
}

Assistant:

void opj_pi_create_encode(opj_pi_iterator_t *pi,
                          opj_cp_t *cp,
                          OPJ_UINT32 tileno,
                          OPJ_UINT32 pino,
                          OPJ_UINT32 tpnum,
                          OPJ_INT32 tppos,
                          J2K_T2_MODE t2_mode)
{
    const OPJ_CHAR *prog;
    OPJ_INT32 i;
    OPJ_UINT32 incr_top = 1, resetX = 0;
    opj_tcp_t *tcps = &cp->tcps[tileno];
    opj_poc_t *tcp = &tcps->pocs[pino];

    prog = opj_j2k_convert_progression_order(tcp->prg);

    pi[pino].first = 1;
    pi[pino].poc.prg = tcp->prg;

    if (!(cp->m_specific_param.m_enc.m_tp_on && ((!OPJ_IS_CINEMA(cp->rsiz) &&
            !OPJ_IS_IMF(cp->rsiz) &&
            (t2_mode == FINAL_PASS)) || OPJ_IS_CINEMA(cp->rsiz) || OPJ_IS_IMF(cp->rsiz)))) {
        pi[pino].poc.resno0 = tcp->resS;
        pi[pino].poc.resno1 = tcp->resE;
        pi[pino].poc.compno0 = tcp->compS;
        pi[pino].poc.compno1 = tcp->compE;
        pi[pino].poc.layno0 = tcp->layS;
        pi[pino].poc.layno1 = tcp->layE;
        pi[pino].poc.precno0 = tcp->prcS;
        pi[pino].poc.precno1 = tcp->prcE;
        pi[pino].poc.tx0 = tcp->txS;
        pi[pino].poc.ty0 = tcp->tyS;
        pi[pino].poc.tx1 = tcp->txE;
        pi[pino].poc.ty1 = tcp->tyE;
    } else {
        for (i = tppos + 1; i < 4; i++) {
            switch (prog[i]) {
            case 'R':
                pi[pino].poc.resno0 = tcp->resS;
                pi[pino].poc.resno1 = tcp->resE;
                break;
            case 'C':
                pi[pino].poc.compno0 = tcp->compS;
                pi[pino].poc.compno1 = tcp->compE;
                break;
            case 'L':
                pi[pino].poc.layno0 = tcp->layS;
                pi[pino].poc.layno1 = tcp->layE;
                break;
            case 'P':
                switch (tcp->prg) {
                case OPJ_LRCP:
                case OPJ_RLCP:
                    pi[pino].poc.precno0 = tcp->prcS;
                    pi[pino].poc.precno1 = tcp->prcE;
                    break;
                default:
                    pi[pino].poc.tx0 = tcp->txS;
                    pi[pino].poc.ty0 = tcp->tyS;
                    pi[pino].poc.tx1 = tcp->txE;
                    pi[pino].poc.ty1 = tcp->tyE;
                    break;
                }
                break;
            }
        }

        if (tpnum == 0) {
            for (i = tppos; i >= 0; i--) {
                switch (prog[i]) {
                case 'C':
                    tcp->comp_t = tcp->compS;
                    pi[pino].poc.compno0 = tcp->comp_t;
                    pi[pino].poc.compno1 = tcp->comp_t + 1;
                    tcp->comp_t += 1;
                    break;
                case 'R':
                    tcp->res_t = tcp->resS;
                    pi[pino].poc.resno0 = tcp->res_t;
                    pi[pino].poc.resno1 = tcp->res_t + 1;
                    tcp->res_t += 1;
                    break;
                case 'L':
                    tcp->lay_t = tcp->layS;
                    pi[pino].poc.layno0 = tcp->lay_t;
                    pi[pino].poc.layno1 = tcp->lay_t + 1;
                    tcp->lay_t += 1;
                    break;
                case 'P':
                    switch (tcp->prg) {
                    case OPJ_LRCP:
                    case OPJ_RLCP:
                        tcp->prc_t = tcp->prcS;
                        pi[pino].poc.precno0 = tcp->prc_t;
                        pi[pino].poc.precno1 = tcp->prc_t + 1;
                        tcp->prc_t += 1;
                        break;
                    default:
                        tcp->tx0_t = tcp->txS;
                        tcp->ty0_t = tcp->tyS;
                        pi[pino].poc.tx0 = tcp->tx0_t;
                        pi[pino].poc.tx1 = tcp->tx0_t + tcp->dx - (tcp->tx0_t % tcp->dx);
                        pi[pino].poc.ty0 = tcp->ty0_t;
                        pi[pino].poc.ty1 = tcp->ty0_t + tcp->dy - (tcp->ty0_t % tcp->dy);
                        tcp->tx0_t = (OPJ_UINT32)pi[pino].poc.tx1;
                        tcp->ty0_t = (OPJ_UINT32)pi[pino].poc.ty1;
                        break;
                    }
                    break;
                }
            }
            incr_top = 1;
        } else {
            for (i = tppos; i >= 0; i--) {
                switch (prog[i]) {
                case 'C':
                    pi[pino].poc.compno0 = tcp->comp_t - 1;
                    pi[pino].poc.compno1 = tcp->comp_t;
                    break;
                case 'R':
                    pi[pino].poc.resno0 = tcp->res_t - 1;
                    pi[pino].poc.resno1 = tcp->res_t;
                    break;
                case 'L':
                    pi[pino].poc.layno0 = tcp->lay_t - 1;
                    pi[pino].poc.layno1 = tcp->lay_t;
                    break;
                case 'P':
                    switch (tcp->prg) {
                    case OPJ_LRCP:
                    case OPJ_RLCP:
                        pi[pino].poc.precno0 = tcp->prc_t - 1;
                        pi[pino].poc.precno1 = tcp->prc_t;
                        break;
                    default:
                        pi[pino].poc.tx0 = tcp->tx0_t - tcp->dx - (tcp->tx0_t % tcp->dx);
                        pi[pino].poc.tx1 = tcp->tx0_t ;
                        pi[pino].poc.ty0 = tcp->ty0_t - tcp->dy - (tcp->ty0_t % tcp->dy);
                        pi[pino].poc.ty1 = tcp->ty0_t ;
                        break;
                    }
                    break;
                }
                if (incr_top == 1) {
                    switch (prog[i]) {
                    case 'R':
                        if (tcp->res_t == tcp->resE) {
                            if (opj_pi_check_next_level(i - 1, cp, tileno, pino, prog)) {
                                tcp->res_t = tcp->resS;
                                pi[pino].poc.resno0 = tcp->res_t;
                                pi[pino].poc.resno1 = tcp->res_t + 1;
                                tcp->res_t += 1;
                                incr_top = 1;
                            } else {
                                incr_top = 0;
                            }
                        } else {
                            pi[pino].poc.resno0 = tcp->res_t;
                            pi[pino].poc.resno1 = tcp->res_t + 1;
                            tcp->res_t += 1;
                            incr_top = 0;
                        }
                        break;
                    case 'C':
                        if (tcp->comp_t == tcp->compE) {
                            if (opj_pi_check_next_level(i - 1, cp, tileno, pino, prog)) {
                                tcp->comp_t = tcp->compS;
                                pi[pino].poc.compno0 = tcp->comp_t;
                                pi[pino].poc.compno1 = tcp->comp_t + 1;
                                tcp->comp_t += 1;
                                incr_top = 1;
                            } else {
                                incr_top = 0;
                            }
                        } else {
                            pi[pino].poc.compno0 = tcp->comp_t;
                            pi[pino].poc.compno1 = tcp->comp_t + 1;
                            tcp->comp_t += 1;
                            incr_top = 0;
                        }
                        break;
                    case 'L':
                        if (tcp->lay_t == tcp->layE) {
                            if (opj_pi_check_next_level(i - 1, cp, tileno, pino, prog)) {
                                tcp->lay_t = tcp->layS;
                                pi[pino].poc.layno0 = tcp->lay_t;
                                pi[pino].poc.layno1 = tcp->lay_t + 1;
                                tcp->lay_t += 1;
                                incr_top = 1;
                            } else {
                                incr_top = 0;
                            }
                        } else {
                            pi[pino].poc.layno0 = tcp->lay_t;
                            pi[pino].poc.layno1 = tcp->lay_t + 1;
                            tcp->lay_t += 1;
                            incr_top = 0;
                        }
                        break;
                    case 'P':
                        switch (tcp->prg) {
                        case OPJ_LRCP:
                        case OPJ_RLCP:
                            if (tcp->prc_t == tcp->prcE) {
                                if (opj_pi_check_next_level(i - 1, cp, tileno, pino, prog)) {
                                    tcp->prc_t = tcp->prcS;
                                    pi[pino].poc.precno0 = tcp->prc_t;
                                    pi[pino].poc.precno1 = tcp->prc_t + 1;
                                    tcp->prc_t += 1;
                                    incr_top = 1;
                                } else {
                                    incr_top = 0;
                                }
                            } else {
                                pi[pino].poc.precno0 = tcp->prc_t;
                                pi[pino].poc.precno1 = tcp->prc_t + 1;
                                tcp->prc_t += 1;
                                incr_top = 0;
                            }
                            break;
                        default:
                            if (tcp->tx0_t >= tcp->txE) {
                                if (tcp->ty0_t >= tcp->tyE) {
                                    if (opj_pi_check_next_level(i - 1, cp, tileno, pino, prog)) {
                                        tcp->ty0_t = tcp->tyS;
                                        pi[pino].poc.ty0 = tcp->ty0_t;
                                        pi[pino].poc.ty1 = tcp->ty0_t + tcp->dy - (tcp->ty0_t % tcp->dy);
                                        tcp->ty0_t = (OPJ_UINT32)pi[pino].poc.ty1;
                                        incr_top = 1;
                                        resetX = 1;
                                    } else {
                                        incr_top = 0;
                                        resetX = 0;
                                    }
                                } else {
                                    pi[pino].poc.ty0 = tcp->ty0_t;
                                    pi[pino].poc.ty1 = tcp->ty0_t + tcp->dy - (tcp->ty0_t % tcp->dy);
                                    tcp->ty0_t = (OPJ_UINT32)pi[pino].poc.ty1;
                                    incr_top = 0;
                                    resetX = 1;
                                }
                                if (resetX == 1) {
                                    tcp->tx0_t = tcp->txS;
                                    pi[pino].poc.tx0 = tcp->tx0_t;
                                    pi[pino].poc.tx1 = tcp->tx0_t + tcp->dx - (tcp->tx0_t % tcp->dx);
                                    tcp->tx0_t = (OPJ_UINT32)pi[pino].poc.tx1;
                                }
                            } else {
                                pi[pino].poc.tx0 = tcp->tx0_t;
                                pi[pino].poc.tx1 = tcp->tx0_t + tcp->dx - (tcp->tx0_t % tcp->dx);
                                tcp->tx0_t = (OPJ_UINT32)pi[pino].poc.tx1;
                                incr_top = 0;
                            }
                            break;
                        }
                        break;
                    }
                }
            }
        }
    }
}